

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::TextureLevelCommonCase::generateTestIterations
          (TextureLevelCommonCase *this,
          vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
          *iterations)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  code *pcVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  deUint32 err;
  undefined4 extraout_var;
  TestError *this_00;
  uint uVar7;
  string local_110;
  TextureGenerationSpec texGen;
  int sampleCount;
  code *local_78;
  uint local_70;
  undefined8 local_68;
  uint uStack_60;
  int iStack_5c;
  GLenum GStack_58;
  bool local_54;
  vector<int,_std::allocator<int>_> samples;
  
  samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  iVar6 = (*((this->super_TextureLevelCase).super_TestCase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  pcVar3 = *(code **)(CONCAT44(extraout_var,iVar6) + 0x800);
  pcVar4 = *(code **)(CONCAT44(extraout_var,iVar6) + 0x880);
  sampleCount = -1;
  uVar2 = (this->super_TextureLevelCase).m_target;
  if ((uVar2 & 0xfffffffd) == 0x9100) {
    (*pcVar4)(uVar2,0x8058,0x9380,1,&sampleCount);
    if ((long)sampleCount < 0) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&texGen,"internal format query failed",(allocator<char> *)&local_110);
      tcu::TestError::TestError(this_00,(string *)&texGen);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    std::vector<int,_std::allocator<int>_>::resize(&samples,(long)sampleCount);
    if (0 < sampleCount) {
      (*pcVar4)((this->super_TextureLevelCase).m_target,0x8058,0x80a9,sampleCount,
                samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start);
      err = (*pcVar3)();
      glu::checkError(err,"get max samples",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureLevelStateQueryTests.cpp"
                      ,0x38e);
    }
  }
  if (samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      == samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish) {
    iVar6 = -1;
  }
  else {
    iVar6 = *samples.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start;
  }
  uVar2 = (this->super_TextureLevelCase).m_target;
  uVar7 = 0x8518;
  if (uVar2 != 0x8513) {
    uVar7 = uVar2;
  }
  paVar1 = &texGen.description.field_2;
  texGen.texBufferDataSize = 0x100;
  texGen.bindWholeArray = false;
  texGen.levels.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  texGen.levels.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  texGen.levels.
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  texGen.description._M_string_length = 0;
  texGen.description.field_2._M_local_buf[0] = '\0';
  texGen.queryTarget = uVar7;
  texGen.bindTarget = uVar2;
  texGen.immutable = true;
  texGen.fixedSamplePos = true;
  texGen.sampleCount = 0;
  texGen.texBufferDataOffset = 0;
  local_68 = glu::getTextureTargetName;
  texGen.description._M_dataplus._M_p = (pointer)paVar1;
  uStack_60 = uVar2;
  tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_110,&local_68);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sampleCount,
                 &local_110,", initial values");
  std::__cxx11::string::operator=((string *)&texGen.description,(string *)&sampleCount);
  std::__cxx11::string::~string((string *)&sampleCount);
  std::__cxx11::string::~string((string *)&local_110);
  std::
  vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
  ::push_back(iterations,&texGen);
  TextureGenerationSpec::~TextureGenerationSpec(&texGen);
  local_70 = uVar2;
  if ((uVar2 & 0xfffffffd) == 0x9100) {
    texGen.texBufferDataSize = 0x100;
    texGen.bindWholeArray = false;
    texGen.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    texGen.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    texGen.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    texGen.description._M_string_length = 0;
    texGen.description.field_2._M_local_buf[0] = '\0';
    texGen.sampleCount = 1;
    texGen.texBufferDataOffset = 0;
    texGen.queryTarget = uVar2;
    texGen.immutable = true;
    texGen.fixedSamplePos = false;
    local_78 = glu::getTextureTargetName;
    texGen.description._M_dataplus._M_p = (pointer)paVar1;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_110,&local_78);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sampleCount
                   ,&local_110,", low sample count");
    std::__cxx11::string::operator=((string *)&texGen.description,(string *)&sampleCount);
    std::__cxx11::string::~string((string *)&sampleCount);
    std::__cxx11::string::~string((string *)&local_110);
    local_68._0_4_ = 0x10;
    local_68._4_4_ = 0x10;
    bVar5 = textureTypeHasDepth(texGen.bindTarget);
    uStack_60 = (uint)bVar5 + (uint)bVar5 * 4 + 1;
    iStack_5c = 0;
    GStack_58 = 0x8058;
    local_54 = false;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ::push_back(&texGen.levels,(value_type *)&local_68);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
    ::push_back(iterations,&texGen);
    TextureGenerationSpec::~TextureGenerationSpec(&texGen);
    texGen.texBufferDataOffset = 0;
    texGen.texBufferDataSize = 0x100;
    texGen.bindWholeArray = false;
    texGen.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    texGen.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    texGen.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    texGen.description._M_string_length = 0;
    texGen.description.field_2._M_local_buf[0] = '\0';
    texGen.bindTarget = uVar2;
    texGen.immutable = true;
    texGen.fixedSamplePos = false;
    local_78 = glu::getTextureTargetName;
    texGen.sampleCount = iVar6;
    texGen.description._M_dataplus._M_p = (pointer)paVar1;
    local_70 = uVar2;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_110,&local_78);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sampleCount
                   ,&local_110,", high sample count");
    std::__cxx11::string::operator=((string *)&texGen.description,(string *)&sampleCount);
    std::__cxx11::string::~string((string *)&sampleCount);
    std::__cxx11::string::~string((string *)&local_110);
    local_68._0_4_ = 0x20;
    local_68._4_4_ = 0x20;
    bVar5 = textureTypeHasDepth(texGen.bindTarget);
    uStack_60 = (uint)bVar5 + (uint)bVar5 * 4 + 1;
    iStack_5c = 0;
    GStack_58 = 0x8058;
    local_54 = false;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ::push_back(&texGen.levels,(value_type *)&local_68);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
    ::push_back(iterations,&texGen);
    TextureGenerationSpec::~TextureGenerationSpec(&texGen);
    texGen.texBufferDataOffset = 0;
    texGen.texBufferDataSize = 0x100;
    texGen.bindWholeArray = false;
    texGen.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    texGen.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    texGen.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    texGen.description._M_string_length = 0;
    texGen.description.field_2._M_local_buf[0] = '\0';
    texGen.bindTarget = uVar2;
    texGen.immutable = true;
    texGen.fixedSamplePos = true;
    local_78 = glu::getTextureTargetName;
    texGen.sampleCount = iVar6;
    texGen.description._M_dataplus._M_p = (pointer)paVar1;
    local_70 = uVar2;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_110,&local_78);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sampleCount
                   ,&local_110,", fixed sample positions");
    std::__cxx11::string::operator=((string *)&texGen.description,(string *)&sampleCount);
    std::__cxx11::string::~string((string *)&sampleCount);
    std::__cxx11::string::~string((string *)&local_110);
    local_68._0_4_ = 0x20;
    local_68._4_4_ = 0x20;
    bVar5 = textureTypeHasDepth(texGen.bindTarget);
    uStack_60 = (uint)bVar5 + (uint)bVar5 * 4 + 1;
    iStack_5c = 0;
    GStack_58 = 0x8058;
    local_54 = false;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ::push_back(&texGen.levels,(value_type *)&local_68);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
    ::push_back(iterations,&texGen);
  }
  else if (uVar2 == 0x8c2a) {
    texGen.immutable = true;
    texGen.fixedSamplePos = true;
    texGen.sampleCount = 0;
    texGen.texBufferDataOffset = 0;
    texGen.texBufferDataSize = 0x100;
    texGen.bindWholeArray = false;
    texGen.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    texGen.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    texGen.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    texGen.description._M_string_length = 0;
    texGen.description.field_2._M_local_buf[0] = '\0';
    texGen.description._M_dataplus._M_p = (pointer)paVar1;
    iVar6 = getPixelSize(0x8058);
    texGen.bindTarget = 0x8c2a;
    texGen.queryTarget = 0x8c2a;
    texGen.immutable = true;
    local_78 = glu::getTextureTargetName;
    local_70 = 0x8c2a;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_110,&local_78);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sampleCount
                   ,&local_110,", whole buffer");
    std::__cxx11::string::operator=((string *)&texGen.description,(string *)&sampleCount);
    std::__cxx11::string::~string((string *)&sampleCount);
    std::__cxx11::string::~string((string *)&local_110);
    texGen.texBufferDataOffset = 0;
    texGen.texBufferDataSize = iVar6 * 0x21 + -1;
    texGen.bindWholeArray = true;
    local_68._0_4_ = 0x20;
    local_68._4_4_ = 1;
    uStack_60 = 1;
    iStack_5c = 0;
    GStack_58 = 0x8058;
    local_54 = false;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ::push_back(&texGen.levels,(value_type *)&local_68);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
    ::push_back(iterations,&texGen);
    TextureGenerationSpec::~TextureGenerationSpec(&texGen);
    texGen.immutable = true;
    texGen.fixedSamplePos = true;
    texGen.sampleCount = 0;
    texGen.texBufferDataOffset = 0;
    texGen.texBufferDataSize = 0x100;
    texGen.bindWholeArray = false;
    texGen.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    texGen.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    texGen.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    texGen.description._M_string_length = 0;
    texGen.description.field_2._M_local_buf[0] = '\0';
    texGen.description._M_dataplus._M_p = (pointer)paVar1;
    iVar6 = getPixelSize(0x8058);
    texGen.bindTarget = 0x8c2a;
    texGen.queryTarget = 0x8c2a;
    texGen.immutable = true;
    local_78 = glu::getTextureTargetName;
    local_70 = 0x8c2a;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_110,&local_78);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sampleCount
                   ,&local_110,", partial buffer");
    std::__cxx11::string::operator=((string *)&texGen.description,(string *)&sampleCount);
    std::__cxx11::string::~string((string *)&sampleCount);
    std::__cxx11::string::~string((string *)&local_110);
    texGen.texBufferDataOffset = 0x100;
    texGen.texBufferDataSize = iVar6 * 0x11 + -1;
    texGen.bindWholeArray = false;
    local_68._0_4_ = 0x10;
    local_68._4_4_ = 1;
    uStack_60 = 1;
    iStack_5c = 0;
    GStack_58 = 0x8058;
    local_54 = false;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ::push_back(&texGen.levels,(value_type *)&local_68);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
    ::push_back(iterations,&texGen);
  }
  else {
    texGen.sampleCount = 0;
    texGen.texBufferDataOffset = 0;
    texGen.texBufferDataSize = 0x100;
    texGen.bindWholeArray = false;
    texGen.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    texGen.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    texGen.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    texGen.description._M_string_length = 0;
    texGen.description.field_2._M_local_buf[0] = '\0';
    texGen.immutable = true;
    texGen.fixedSamplePos = true;
    local_78 = glu::getTextureTargetName;
    texGen.description._M_dataplus._M_p = (pointer)paVar1;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_110,&local_78);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sampleCount
                   ,&local_110,", immutable");
    std::__cxx11::string::operator=((string *)&texGen.description,(string *)&sampleCount);
    std::__cxx11::string::~string((string *)&sampleCount);
    std::__cxx11::string::~string((string *)&local_110);
    local_68._0_4_ = 0x20;
    local_68._4_4_ = 0x20;
    bVar5 = textureTypeHasDepth(texGen.bindTarget);
    uStack_60 = (uint)bVar5 + (uint)bVar5 * 4 + 1;
    iStack_5c = 0;
    GStack_58 = 0x8058;
    local_54 = false;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ::push_back(&texGen.levels,(value_type *)&local_68);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
    ::push_back(iterations,&texGen);
    TextureGenerationSpec::~TextureGenerationSpec(&texGen);
    texGen.sampleCount = 0;
    texGen.texBufferDataOffset = 0;
    texGen.texBufferDataSize = 0x100;
    texGen.bindWholeArray = false;
    texGen.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    texGen.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    texGen.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    texGen.description._M_string_length = 0;
    texGen.description.field_2._M_local_buf[0] = '\0';
    texGen.immutable = false;
    texGen.fixedSamplePos = true;
    texGen.bindTarget = uVar2;
    local_78 = glu::getTextureTargetName;
    texGen.description._M_dataplus._M_p = (pointer)paVar1;
    local_70 = uVar2;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_110,&local_78);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sampleCount
                   ,&local_110,", mutable");
    std::__cxx11::string::operator=((string *)&texGen.description,(string *)&sampleCount);
    std::__cxx11::string::~string((string *)&sampleCount);
    std::__cxx11::string::~string((string *)&local_110);
    local_68._4_4_ = 0x40;
    if (uVar2 == 0x9009 || uVar2 == 0x8513) {
      local_68._4_4_ = 0x10;
    }
    local_68._0_4_ = 0x10;
    bVar5 = textureTypeHasDepth(texGen.bindTarget);
    uStack_60 = (uint)bVar5 + (uint)bVar5 * 4 + 1;
    iStack_5c = 0;
    GStack_58 = 0x8058;
    local_54 = false;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ::push_back(&texGen.levels,(value_type *)&local_68);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
    ::push_back(iterations,&texGen);
    TextureGenerationSpec::~TextureGenerationSpec(&texGen);
    texGen.sampleCount = 0;
    texGen.texBufferDataOffset = 0;
    texGen.texBufferDataSize = 0x100;
    texGen.bindWholeArray = false;
    texGen.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    texGen.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    texGen.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    texGen.description._M_string_length = 0;
    texGen.description.field_2._M_local_buf[0] = '\0';
    texGen.immutable = false;
    texGen.fixedSamplePos = true;
    texGen.bindTarget = uVar2;
    local_78 = glu::getTextureTargetName;
    texGen.description._M_dataplus._M_p = (pointer)paVar1;
    local_70 = uVar2;
    tcu::Format::Enum<int,2ul>::toString_abi_cxx11_(&local_110,&local_78);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&sampleCount
                   ,&local_110,", mip level 3");
    std::__cxx11::string::operator=((string *)&texGen.description,(string *)&sampleCount);
    std::__cxx11::string::~string((string *)&sampleCount);
    std::__cxx11::string::~string((string *)&local_110);
    local_68._4_4_ = (uint)(uVar2 != 0x9009 && uVar2 != 0x8513) * 4 + 4;
    local_68._0_4_ = 4;
    bVar5 = textureTypeHasDepth(texGen.bindTarget);
    uStack_60 = (uint)bVar5 + (uint)bVar5 * 4 + 1;
    iStack_5c = 3;
    GStack_58 = 0x8058;
    local_54 = false;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec::TextureLevelSpec>_>
    ::push_back(&texGen.levels,(value_type *)&local_68);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::TextureGenerationSpec>_>
    ::push_back(iterations,&texGen);
  }
  TextureGenerationSpec::~TextureGenerationSpec(&texGen);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&samples.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void TextureLevelCommonCase::generateTestIterations (std::vector<TextureGenerationSpec>& iterations)
{
	const glw::GLenum	internalFormat = GL_RGBA8;
	int					maxSamples;
	std::vector<int>	samples;

	getFormatSamples(internalFormat, samples);
	if (samples.empty())
		maxSamples = -1;
	else
		maxSamples = samples[0];

	generateColorTextureGenerationGroup(iterations, m_target, maxSamples, internalFormat);
}